

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdiff.c
# Opt level: O3

void split(int64_t *I,int64_t *V,int64_t start,int64_t len,int64_t h)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  lVar7 = start;
  if (0xf < len) {
    do {
      lVar12 = V[h + *(long *)((long)I + lVar7 * 8 + (len & 0xfffffffffffffffeU) * 4)];
      lVar11 = len + lVar7;
      lVar6 = 0;
      lVar4 = lVar7;
      lVar14 = 0;
      do {
        lVar13 = lVar14;
        lVar2 = V[h + I[lVar4]];
        lVar6 = lVar6 + (ulong)(lVar2 < lVar12);
        lVar14 = (ulong)(lVar2 == lVar12) + lVar13;
        lVar4 = lVar4 + 1;
      } while (lVar4 < lVar11);
      lVar4 = lVar6 + lVar7;
      start = lVar4 + lVar14;
      if (lVar6 == 0) {
        lVar8 = 0;
        lVar5 = 0;
      }
      else {
        lVar5 = 0;
        lVar8 = 0;
        lVar10 = lVar7;
        do {
          lVar3 = I[lVar10];
          if (V[h + lVar3] < lVar12) {
            lVar10 = lVar10 + 1;
          }
          else if (V[h + lVar3] == lVar12) {
            I[lVar10] = I[lVar4 + lVar8];
            I[lVar4 + lVar8] = lVar3;
            lVar8 = lVar8 + 1;
          }
          else {
            I[lVar10] = I[start + lVar5];
            I[start + lVar5] = lVar3;
            lVar5 = lVar5 + 1;
          }
        } while (lVar10 < lVar4);
      }
      while (lVar8 < lVar14) {
        lVar10 = I[lVar4 + lVar8];
        if (V[h + lVar10] == lVar12) {
          lVar8 = lVar8 + 1;
        }
        else {
          I[lVar4 + lVar8] = I[start + lVar5];
          I[start + lVar5] = lVar10;
          lVar5 = lVar5 + 1;
        }
      }
      if (lVar6 != 0) {
        split(I,V,lVar7,lVar6,h);
      }
      if (lVar14 != 0) {
        lVar7 = 0;
        do {
          V[I[lVar4 + lVar7]] = start + -1;
          lVar7 = lVar7 + 1;
        } while (lVar13 + (ulong)(lVar2 == lVar12) != lVar7);
      }
      if (lVar4 == start + -1) {
        I[lVar4] = -1;
      }
      len = lVar11 - start;
      if (len == 0 || lVar11 < start) {
        return;
      }
      lVar7 = start;
    } while (0xf < len);
  }
  if (0 < len) {
    lVar7 = len + start;
    do {
      plVar1 = I + start;
      lVar12 = start + 1;
      lVar4 = 1;
      if (lVar12 < lVar7) {
        iVar9 = V[h + *plVar1];
        do {
          lVar14 = V[h + I[lVar12]];
          lVar6 = iVar9;
          if (lVar14 < iVar9) {
            lVar6 = lVar14;
            lVar4 = 0;
          }
          if (lVar14 <= iVar9) {
            lVar14 = plVar1[lVar4];
            plVar1[lVar4] = I[lVar12];
            I[lVar12] = lVar14;
            lVar4 = lVar4 + 1;
          }
          lVar12 = lVar12 + 1;
          iVar9 = lVar6;
        } while (lVar12 < lVar7);
        if (0 < lVar4) goto LAB_0010c0e0;
      }
      else {
LAB_0010c0e0:
        lVar12 = 0;
        do {
          V[plVar1[lVar12]] = start + lVar4 + -1;
          lVar12 = lVar12 + 1;
        } while (lVar4 != lVar12);
        if (lVar4 == 1) {
          *plVar1 = -1;
          lVar4 = 1;
        }
      }
      start = start + lVar4;
    } while (start < lVar7);
  }
  return;
}

Assistant:

static void split(int64_t *I,int64_t *V,int64_t start,int64_t len,int64_t h)
{
	int64_t i,j,k,x,tmp,jj,kk;

	if(len<16) {
		for(k=start;k<start+len;k+=j) {
			j=1;x=V[I[k]+h];
			for(i=1;k+i<start+len;i++) {
				if(V[I[k+i]+h]<x) {
					x=V[I[k+i]+h];
					j=0;
				};
				if(V[I[k+i]+h]==x) {
					tmp=I[k+j];I[k+j]=I[k+i];I[k+i]=tmp;
					j++;
				};
			};
			for(i=0;i<j;i++) V[I[k+i]]=k+j-1;
			if(j==1) I[k]=-1;
		};
		return;
	};

	x=V[I[start+len/2]+h];
	jj=0;kk=0;
	for(i=start;i<start+len;i++) {
		if(V[I[i]+h]<x) jj++;
		if(V[I[i]+h]==x) kk++;
	};
	jj+=start;kk+=jj;

	i=start;j=0;k=0;
	while(i<jj) {
		if(V[I[i]+h]<x) {
			i++;
		} else if(V[I[i]+h]==x) {
			tmp=I[i];I[i]=I[jj+j];I[jj+j]=tmp;
			j++;
		} else {
			tmp=I[i];I[i]=I[kk+k];I[kk+k]=tmp;
			k++;
		};
	};

	while(jj+j<kk) {
		if(V[I[jj+j]+h]==x) {
			j++;
		} else {
			tmp=I[jj+j];I[jj+j]=I[kk+k];I[kk+k]=tmp;
			k++;
		};
	};

	if(jj>start) split(I,V,start,jj-start,h);

	for(i=0;i<kk-jj;i++) V[I[jj+i]]=kk-1;
	if(jj==kk-1) I[jj]=-1;

	if(start+len>kk) split(I,V,kk,start+len-kk,h);
}